

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_run_optimize(roaring64_bitmap_t *r)

{
  container_t *pcVar1;
  uint8_t new_typecode;
  leaf_t *leaf;
  _Bool has_run_container;
  art_iterator_t it;
  undefined1 local_a1;
  _Bool in_stack_ffffffffffffff6f;
  byte bVar2;
  art_t *in_stack_ffffffffffffff70;
  undefined8 local_88;
  uint8_t *in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffe7;
  container_t *in_stack_ffffffffffffffe8;
  
  art_init_iterator(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  bVar2 = 0;
  while (local_88 != 0) {
    pcVar1 = convert_run_optimize
                       (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe7,
                        in_stack_ffffffffffffffd8);
    *(container_t **)(local_88 + 8) = pcVar1;
    *(char *)(local_88 + 6) = local_a1;
    bVar2 = (bVar2 & 1) != 0 || local_a1 == '\x03';
    art_iterator_next((art_iterator_t *)0x106d42);
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool roaring64_bitmap_run_optimize(roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    bool has_run_container = false;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        uint8_t new_typecode;
        // We don't need to free the existing container if a new one was
        // created, convert_run_optimize does that internally.
        leaf->container = convert_run_optimize(leaf->container, leaf->typecode,
                                               &new_typecode);
        leaf->typecode = new_typecode;
        has_run_container |= new_typecode == RUN_CONTAINER_TYPE;
        art_iterator_next(&it);
    }
    return has_run_container;
}